

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# leaf_dist_histogram_converter_impl.h
# Opt level: O2

int __thiscall
leaf_dist_histogram_converter::Converter<label::StringLabel>::create_leaf_dist_histrogram
          (Converter<label::StringLabel> *this,Node<label::StringLabel> *tree_node,
          unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
          *leaf_dist_histogram,int *tree_size)

{
  pointer pNVar1;
  int iVar2;
  undefined8 in_RAX;
  mapped_type *pmVar3;
  int iVar4;
  Node<label::StringLabel> *child;
  pointer tree_node_00;
  undefined8 uStack_38;
  
  pNVar1 = (tree_node->children_).
           super__Vector_base<node::Node<label::StringLabel>,_std::allocator<node::Node<label::StringLabel>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  iVar4 = 0;
  uStack_38 = in_RAX;
  for (tree_node_00 = (tree_node->children_).
                      super__Vector_base<node::Node<label::StringLabel>,_std::allocator<node::Node<label::StringLabel>_>_>
                      ._M_impl.super__Vector_impl_data._M_start; tree_node_00 != pNVar1;
      tree_node_00 = tree_node_00 + 1) {
    iVar2 = create_leaf_dist_histrogram(this,tree_node_00,leaf_dist_histogram,tree_size);
    if (iVar4 <= iVar2) {
      iVar4 = iVar2;
    }
  }
  uStack_38._4_4_ = iVar4 + 1;
  pmVar3 = std::__detail::
           _Map_base<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)leaf_dist_histogram,(key_type *)((long)&uStack_38 + 4));
  *pmVar3 = *pmVar3 + 1;
  if (this->max_leaf_distance_ < uStack_38._4_4_) {
    this->max_leaf_distance_ = uStack_38._4_4_;
  }
  *tree_size = *tree_size + 1;
  return uStack_38._4_4_;
}

Assistant:

int Converter<Label>::create_leaf_dist_histrogram(
    const node::Node<Label>& tree_node, 
    std::unordered_map<int, int>& leaf_dist_histogram, int& tree_size) {

  // the leaf distance is the minimum leaf distance of a nodes children + 1
  int max_child_leaf_dist = 0;
  // do recursively for all children
  for (const auto& child: tree_node.get_children()) {
    int child_dist = create_leaf_dist_histrogram(child, leaf_dist_histogram, tree_size);
    if(max_child_leaf_dist < child_dist)
      max_child_leaf_dist = child_dist;
  }
  // the leaf distance is the minimum leaf distance of a nodes children + 1
  ++max_child_leaf_dist;
  // increase leaf distance count for current node
  ++leaf_dist_histogram[max_child_leaf_dist];
  // store maximum leaf distance of the collection
  if(max_child_leaf_dist > max_leaf_distance_)
    max_leaf_distance_ = max_child_leaf_dist;
  // increase tree size
  ++tree_size;

  return max_child_leaf_dist;
}